

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uint uVar1;
  uchar *puVar2;
  char *z;
  uchar *z_00;
  uint uVar3;
  uchar *puVar4;
  int token;
  sqlite3 *local_40;
  uchar *local_38;
  
  puVar2 = sqlite3_value_text(*argv);
  local_38 = sqlite3_value_text(argv[1]);
  if (puVar2 != (uchar *)0x0) {
    local_40 = context->pOut->db;
    z_00 = puVar2;
    uVar1 = 0;
    while (uVar3 = uVar1, puVar4 = z_00, z_00 = puVar4, uVar1 = uVar3, *puVar4 != '\0') {
      do {
        z_00 = z_00 + (int)uVar1;
        uVar1 = sqlite3GetToken(z_00,&token);
      } while (token == 0xa3);
      if ((token == 0x7d) || (token == 0x16)) {
        z = sqlite3MPrintf(local_40,"%.*s\"%w\"%s",(ulong)(uint)((int)puVar4 - (int)puVar2),puVar2,
                           local_38,puVar4 + uVar3);
        sqlite3_result_text(context,z,-1,sqlite3MallocSize);
        return;
      }
    }
  }
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  unsigned char const *zSql = sqlite3_value_text(argv[0]);
  unsigned char const *zTableName = sqlite3_value_text(argv[1]);

  int token;
  Token tname;
  unsigned char const *zCsr = zSql;
  int len = 0;
  char *zRet;

  sqlite3 *db = sqlite3_context_db_handle(context);

  UNUSED_PARAMETER(NotUsed);

  /* The principle used to locate the table name in the CREATE TABLE 
  ** statement is that the table name is the first non-space token that
  ** is immediately followed by a TK_LP or TK_USING token.
  */
  if( zSql ){
    do {
      if( !*zCsr ){
        /* Ran out of input before finding an opening bracket. Return NULL. */
        return;
      }

      /* Store the token that zCsr points to in tname. */
      tname.z = (char*)zCsr;
      tname.n = len;

      /* Advance zCsr to the next token. Store that token type in 'token',
      ** and its length in 'len' (to be used next iteration of this loop).
      */
      do {
        zCsr += len;
        len = sqlite3GetToken(zCsr, &token);
      } while( token==TK_SPACE );
      assert( len>0 );
    } while( token!=TK_LP && token!=TK_USING );

    zRet = sqlite3MPrintf(db, "%.*s\"%w\"%s", (int)(((u8*)tname.z) - zSql),
       zSql, zTableName, tname.z+tname.n);
    sqlite3_result_text(context, zRet, -1, SQLITE_DYNAMIC);
  }
}